

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_from_utf16
                  (archive_string *as,void *_p,size_t bytes,archive_string_conv *sc,wchar_t be)

{
  archive_string *paVar1;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t ret;
  wchar_t n;
  uint32_t uc;
  char *mbs;
  char *utf16;
  archive_string_conv *paStack_30;
  wchar_t be_local;
  archive_string_conv *sc_local;
  size_t bytes_local;
  void *_p_local;
  archive_string *as_local;
  
  local_54 = L'\0';
  mbs = (char *)_p;
  utf16._4_4_ = be;
  paStack_30 = sc;
  sc_local = (archive_string_conv *)bytes;
  bytes_local = (size_t)_p;
  _p_local = as;
  paVar1 = archive_string_ensure(as,as->length + bytes + 1);
  if (paVar1 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    _n = (undefined1 *)(*_p_local + *(long *)((long)_p_local + 8));
    while( true ) {
      local_50 = utf16_to_unicode((uint32_t *)&ret,mbs,(size_t)sc_local,utf16._4_4_);
      if (local_50 == L'\0') break;
      if (local_50 < L'\0') {
        local_50 = -local_50;
        local_54 = L'\xffffffff';
      }
      sc_local = (archive_string_conv *)((long)sc_local - (long)local_50);
      mbs = mbs + local_50;
      if ((uint)ret < 0x80) {
        *_n = (char)ret;
      }
      else {
        *_n = 0x3f;
        local_54 = L'\xffffffff';
      }
      _n = _n + 1;
    }
    *(long *)((long)_p_local + 8) = (long)_n - *_p_local;
    *(undefined1 *)(*_p_local + *(long *)((long)_p_local + 8)) = 0;
    as_local._4_4_ = local_54;
  }
  return as_local._4_4_;
}

Assistant:

static int
best_effort_strncat_from_utf16(struct archive_string *as, const void *_p,
    size_t bytes, struct archive_string_conv *sc, int be)
{
	const char *utf16 = (const char *)_p;
	char *mbs;
	uint32_t uc;
	int n, ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	if (archive_string_ensure(as, as->length + bytes +1) == NULL)
		return (-1);
	mbs = as->s + as->length;

	while ((n = utf16_to_unicode(&uc, utf16, bytes, be)) != 0) {
		if (n < 0) {
			n *= -1;
			ret =  -1;
		}
		bytes -= n;
		utf16 += n;

		if (uc > 127) {
			/* We cannot handle it. */
			*mbs++ = '?';
			ret =  -1;
		} else
			*mbs++ = (char)uc;
	}
	as->length = mbs - as->s;
	as->s[as->length] = '\0';
	return (ret);
}